

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O2

int repeat_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  undefined4 uVar2;
  float fVar3;
  
  if (field == 1) {
    *(bool *)value = segment->mix == repeat_segment_mix_bypass;
    return 1;
  }
  pvVar1 = segment->data;
  if (field == 2) {
    uVar2 = *(undefined4 *)((long)pvVar1 + 0x24);
LAB_0013ea52:
    *(undefined4 *)value = uVar2;
  }
  else {
    if (field == 0x38) {
      fVar3 = (float)*(uint *)((long)pvVar1 + 0x1c) / (float)*(uint *)((long)pvVar1 + 0x24);
    }
    else {
      if (field == 0x1f) {
        uVar2 = *(undefined4 *)((long)pvVar1 + 0x28);
        goto LAB_0013ea52;
      }
      if (field != 0x1e) {
        mixed_err(7);
        return 0;
      }
      fVar3 = *(float *)((long)pvVar1 + 0x20);
    }
    *(float *)value = fVar3;
  }
  return 1;
}

Assistant:

int repeat_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;
  switch(field){
  case MIXED_REPEAT_TIME: *((float *)value) = data->time; break;
  case MIXED_REPEAT_MODE: *((enum mixed_repeat_mode *)value) = data->mode; break;
  case MIXED_REPEAT_POSITION: *((float *)value) = data->buffer_index/(float)data->samplerate; break;
  case MIXED_SAMPLERATE: *((uint32_t *)value) = data->samplerate; break;
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == repeat_segment_mix_bypass); break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}